

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Federate * __thiscall helics::Federate::operator=(Federate *this,Federate *fed)

{
  Modes __i;
  long in_RSI;
  Federate *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  Modes tstate;
  undefined4 in_stack_ffffffffffffffc8;
  memory_order __m;
  
  __m = seq_cst;
  __i = CLI::std::atomic<helics::Federate::Modes>::load
                  ((atomic<helics::Federate::Modes> *)(in_RSI + 8),seq_cst);
  std::atomic<helics::Federate::Modes>::store(&in_RDI->currentMode,__i,__m);
  std::atomic<helics::Federate::Modes>::store
            ((atomic<helics::Federate::Modes> *)(in_RSI + 8),FINALIZE,__m);
  (in_RDI->fedID).fid = *(BaseType *)(in_RSI + 0x10);
  std::shared_ptr<helics::Core>::operator=
            ((shared_ptr<helics::Core> *)in_RDI,
             (shared_ptr<helics::Core> *)CONCAT44(__m,in_stack_ffffffffffffffc8));
  CoreFactory::getEmptyCore();
  std::shared_ptr<helics::Core>::operator=
            ((shared_ptr<helics::Core> *)in_RDI,
             (shared_ptr<helics::Core> *)CONCAT44(__m,in_stack_ffffffffffffffc8));
  CLI::std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x30d12c);
  (in_RDI->mCurrentTime).internalTimeCode = *(baseType *)(in_RSI + 0x28);
  in_RDI->nameSegmentSeparator = *(char *)(in_RSI + 9);
  in_RDI->strictConfigChecking = (bool)(*(byte *)(in_RSI + 10) & 1);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator=((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)in_RDI,
              (unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)CONCAT44(__m,in_stack_ffffffffffffffc8));
  in_RDI->observerMode = (bool)(*(byte *)(in_RSI + 0xc) & 1);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator=((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)in_RDI,
              (unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)CONCAT44(__m,in_stack_ffffffffffffffc8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

Federate& Federate::operator=(Federate&& fed) noexcept
{
    auto tstate = fed.currentMode.load();
    currentMode.store(tstate);
    fed.currentMode.store(Modes::FINALIZE);
    fedID = fed.fedID;
    coreObject = std::move(fed.coreObject);
    fed.coreObject = CoreFactory::getEmptyCore();
    mCurrentTime = fed.mCurrentTime;
    nameSegmentSeparator = fed.nameSegmentSeparator;
    strictConfigChecking = fed.strictConfigChecking;
    asyncCallInfo = std::move(fed.asyncCallInfo);
    observerMode = fed.observerMode;
    cManager = std::move(fed.cManager);
    mName = std::move(fed.mName);
    return *this;
}